

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if.c
# Opt level: O2

int gpio_trigger(uint user_gpio,uint pulseLen,uint32_t level)

{
  int iVar1;
  uint32_t level_local;
  gpioExtent_t ext [1];
  
  ext[0].ptr = &level_local;
  ext[0].size = 4;
  level_local = level;
  iVar1 = pigpio_command_ext(gPigCommand,0x25,user_gpio,pulseLen,4,1,ext,1);
  return iVar1;
}

Assistant:

int gpio_trigger(unsigned user_gpio, unsigned pulseLen, uint32_t level)
{
   gpioExtent_t ext[1];
   
   /*
   p1=user_gpio
   p2=pulseLen
   p3=4
   ## extension ##
   unsigned level
   */

   ext[0].size = sizeof(uint32_t);
   ext[0].ptr = &level;

   return pigpio_command_ext(
      gPigCommand, PI_CMD_TRIG, user_gpio, pulseLen, 4, 1, ext, 1);
}